

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O3

void p_tree_foreach(PTree *tree,PTraverseFunc traverse_func,ppointer user_data)

{
  PTreeBaseNode *pPVar1;
  int iVar2;
  PTreeBaseNode *pPVar3;
  PTreeBaseNode *pPVar4;
  int iVar5;
  PTreeBaseNode *pPVar6;
  
  if (((tree != (PTree *)0x0) && (traverse_func != (PTraverseFunc)0x0)) &&
     (tree->root != (PTreeBaseNode *)0x0)) {
    iVar2 = 0;
    iVar5 = 0;
    pPVar6 = tree->root;
    do {
      pPVar3 = pPVar6->left;
      pPVar1 = pPVar3;
      if (pPVar3 == (PTreeBaseNode *)0x0) {
        if (iVar2 == 0) {
          iVar2 = (*traverse_func)(pPVar6->key,pPVar6->value,user_data);
        }
        pPVar3 = pPVar6->right;
      }
      else {
        do {
          pPVar4 = pPVar1;
          pPVar1 = pPVar4->right;
          if (pPVar1 == (PTreeBaseNode *)0x0) break;
        } while (pPVar1 != pPVar6);
        if (pPVar1 == (PTreeBaseNode *)0x0) {
          pPVar4->right = pPVar6;
          iVar5 = iVar5 + 1;
        }
        else {
          if (iVar2 == 0) {
            iVar2 = (*traverse_func)(pPVar6->key,pPVar6->value,user_data);
          }
          pPVar3 = pPVar6->right;
          pPVar4->right = (PTreeBaseNode_ *)0x0;
          iVar5 = iVar5 + -1;
          if (iVar2 == 1 && iVar5 == 0) {
            return;
          }
        }
      }
      pPVar6 = pPVar3;
    } while (pPVar3 != (PTreeBaseNode *)0x0);
  }
  return;
}

Assistant:

P_LIB_API void
p_tree_foreach (PTree		*tree,
		PTraverseFunc	traverse_func,
		ppointer	user_data)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	pint		mod_counter;
	pboolean	need_stop;

	if (P_UNLIKELY (tree == NULL || traverse_func == NULL))
		return;

	if (P_UNLIKELY (tree->root == NULL))
		return;

	cur_node    = tree->root;
	mod_counter = 0;
	need_stop   = FALSE;

	while (cur_node != NULL) {
		if (cur_node->left == NULL) {
			if (need_stop == FALSE)
				need_stop = traverse_func (cur_node->key,
							   cur_node->value,
							   user_data);

			cur_node = cur_node->right;
		} else {
			prev_node = cur_node->left;

			while (prev_node->right != NULL && prev_node->right != cur_node)
				prev_node = prev_node->right;

			if (prev_node->right == NULL) {
				prev_node->right = cur_node;
				cur_node         = cur_node->left;

				++mod_counter;
			} else {
				if (need_stop == FALSE)
					need_stop = traverse_func (cur_node->key,
								   cur_node->value,
								   user_data);

				cur_node         = cur_node->right;
				prev_node->right = NULL;

				--mod_counter;

				if (need_stop == TRUE && mod_counter == 0)
					return;
			}
		}
	}
}